

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O1

_Bool parse_color(element_t *element,int id,color_t *color,_Bool inherit)

{
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  attribute *paVar4;
  string_t *psVar5;
  string_t *unaff_R12;
  char *it;
  char *local_38;
  
  do {
    for (paVar4 = element->attributes; paVar4 != (attribute *)0x0; paVar4 = paVar4->next) {
      if (paVar4->id == id) {
        if (((inherit) && ((paVar4->value).length == 7)) &&
           (iVar3 = strncmp((paVar4->value).data,"inherit",7), iVar3 == 0)) {
          bVar1 = true;
        }
        else {
          bVar1 = false;
          unaff_R12 = &paVar4->value;
        }
        if (!bVar1) {
          _Var2 = false;
          goto LAB_001098a2;
        }
        break;
      }
    }
    element = element->parent;
    _Var2 = true;
LAB_001098a2:
    psVar5 = unaff_R12;
    if (((_Var2 == false) || (psVar5 = (string_t *)0x0, !inherit)) || (element == (element_t *)0x0))
    {
      if (psVar5 != (string_t *)0x0) {
        local_38 = psVar5->data;
        _Var2 = parse_color_value(&local_38,local_38 + psVar5->length,color);
      }
      return _Var2;
    }
  } while( true );
}

Assistant:

static bool parse_color(const element_t* element, int id, color_t* color, bool inherit)
{
    const string_t* value = find_attribute(element, id, inherit);
    if(value == NULL)
        return false;
    const char* it = value->data;
    const char* end = it + value->length;
    if(parse_color_value(&it, end, color))
        return it == end;
    return false;
}